

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::MockTest::RunImpl(MockTest *this,TestResults *testResults_)

{
  int local_1c;
  int i;
  TestResults *testResults__local;
  MockTest *this_local;
  
  for (local_1c = 0; local_1c < *(int *)&(this->super_Test).field_0x34; local_1c = local_1c + 1) {
    if (((this->super_Test).field_0x32 & 1) == 0) {
      if (((this->super_Test).field_0x31 & 1) == 0) {
        UnitTest::TestResults::OnTestFailure(testResults_,&(this->super_Test).m_details,"message");
      }
    }
    else {
      UnitTest::ReportAssert("desc","file",0);
    }
  }
  return;
}

Assistant:

virtual void RunImpl(TestResults& testResults_) const
    {
        for (int i=0; i < count; ++i)
        {
            if (asserted)
                ReportAssert("desc", "file", 0);
            else if (!success)
                testResults_.OnTestFailure(m_details, "message");
        }
    }